

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O2

void __thiscall rpc_tests::help_example::test_method(help_example *this)

{
  string str;
  string key;
  string key_00;
  string key_01;
  string str_00;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  UniValue val_03;
  UniValue val_04;
  long lVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator pvVar3;
  iterator in_R9;
  UniValue *pUVar4;
  string *psVar5;
  long in_FS_OFFSET;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_00;
  const_string file_02;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_01;
  const_string file_03;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_02;
  const_string file_04;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_03;
  const_string file_05;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_04;
  const_string file_06;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_05;
  const_string file_07;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_06;
  const_string file_08;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_07;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_08;
  const_string file_09;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_09;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_10;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  undefined8 in_stack_fffffffffffff778;
  undefined8 in_stack_fffffffffffff780;
  undefined8 in_stack_fffffffffffff788;
  undefined8 in_stack_fffffffffffff790;
  undefined8 in_stack_fffffffffffff798;
  undefined8 in_stack_fffffffffffff7a0;
  undefined1 in_stack_fffffffffffff7a8 [39];
  bool in_stack_fffffffffffff7cf;
  undefined1 in_stack_fffffffffffff7d0 [32];
  char *local_810;
  char *local_808;
  undefined1 *local_800;
  undefined1 *local_7f8;
  char *local_7f0;
  char *local_7e8;
  char *local_7e0;
  char *local_7d8;
  undefined1 *local_7d0;
  undefined1 *local_7c8;
  char *local_7c0;
  char *local_7b8;
  char *local_7b0;
  char *local_7a8;
  undefined1 *local_7a0;
  undefined1 *local_798;
  char *local_790;
  char *local_788;
  char *local_780;
  char *local_778;
  undefined1 *local_770;
  undefined1 *local_768;
  char *local_760;
  char *local_758;
  char *local_750;
  char *local_748;
  undefined1 *local_740;
  undefined1 *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  char *local_718;
  undefined1 *local_710;
  undefined1 *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  char *local_6e8;
  undefined1 *local_6e0;
  undefined1 *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  undefined1 *local_6b0;
  undefined1 *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  char *local_688;
  undefined1 *local_680;
  undefined1 *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  char *local_658;
  undefined1 *local_650;
  undefined1 *local_648;
  char *local_640;
  char *local_638;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  local_630;
  undefined1 local_618 [120];
  string local_5a0;
  string local_580;
  string local_560;
  string local_540;
  UniValue local_520;
  UniValue local_4c8;
  UniValue local_470;
  undefined1 *local_418;
  undefined8 local_410;
  undefined1 local_408 [16];
  UniValue arr_value;
  undefined1 local_3a0 [32];
  UniValue local_380;
  string local_328 [32];
  UniValue local_308;
  string local_2b0 [32];
  UniValue local_290;
  string local_238 [32];
  undefined1 *local_218;
  undefined8 local_210;
  undefined1 local_208 [16];
  UniValue obj_value;
  undefined1 local_1a0 [120];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_128;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_b0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[4],_const_char_(&)[4],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)local_1a0,(char (*) [4])0xc8537f,(char (*) [4])0xc7eff8);
  obj_value.typ._0_1_ = VOBJ;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[2],_bool,_true>(&local_128,(char (*) [2])0xb6804f,(bool *)&obj_value);
  local_618._0_4_ = 1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[2],_int,_true>(&local_b0,(char (*) [2])0xcac546,(int *)local_618);
  __l._M_len = 3;
  __l._M_array = (iterator)local_1a0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector(&local_630,__l,(allocator_type *)&arr_value);
  lVar1 = 0xf0;
  do {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
             *)(local_1a0 + lVar1));
    lVar1 = lVar1 + -0x78;
  } while (lVar1 != -0x78);
  local_640 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_638 = "";
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  local_648 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x22c;
  file.m_begin = (iterator)&local_640;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_650,msg);
  local_1a0[8] = 0;
  local_1a0._0_8_ = &PTR__lazy_ostream_011480b0;
  local_1a0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_660 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_658 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&obj_value,"test",(allocator<char> *)&arr_value);
  HelpExampleCliNamed((string *)local_618,(string *)&obj_value,&local_630);
  pvVar2 = (iterator)0x2;
  pvVar3 = local_618;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[46]>
            (local_1a0,&local_660,0x22c,1,2,pvVar3,"HelpExampleCliNamed(\"test\", args)",
             "> bitcoin-cli -named test foo=bar b=true n=1\n",
             "\"> bitcoin-cli -named test foo=bar b=true n=1\\n\"");
  std::__cxx11::string::~string((string *)local_618);
  std::__cxx11::string::~string((string *)&obj_value);
  local_670 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_668 = "";
  local_680 = &boost::unit_test::basic_cstring<char_const>::null;
  local_678 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x22d;
  file_00.m_begin = (iterator)&local_670;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_680,
             msg_00);
  local_1a0[8] = 0;
  local_1a0._0_8_ = &PTR__lazy_ostream_011480b0;
  local_1a0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_690 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_688 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&obj_value,"test",(allocator<char> *)&arr_value);
  HelpExampleRpcNamed((string *)local_618,(string *)&obj_value,&local_630);
  pvVar2 = (iterator)0x2;
  pvVar3 = local_618;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[196]>
            (local_1a0,&local_690,0x22d,1,2,pvVar3,"HelpExampleRpcNamed(\"test\", args)",
             "> curl --user myusername --data-binary \'{\"jsonrpc\": \"2.0\", \"id\": \"curltest\", \"method\": \"test\", \"params\": {\"foo\":\"bar\",\"b\":true,\"n\":1}}\' -H \'content-type: application/json\' http://127.0.0.1:8332/\n"
             ,
             "\"> curl --user myusername --data-binary \'{\\\"jsonrpc\\\": \\\"2.0\\\", \\\"id\\\": \\\"curltest\\\", \\\"method\\\": \\\"test\\\", \\\"params\\\": {\\\"foo\\\":\\\"bar\\\",\\\"b\\\":true,\\\"n\\\":1}}\' -H \'content-type: application/json\' http://127.0.0.1:8332/\\n\""
            );
  std::__cxx11::string::~string((string *)local_618);
  std::__cxx11::string::~string((string *)&obj_value);
  local_6a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_698 = "";
  local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x230;
  file_01.m_begin = (iterator)&local_6a0;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_6b0,
             msg_01);
  local_618[8] = 0;
  local_618._0_8_ = &PTR__lazy_ostream_011480b0;
  local_618._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_618._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_6c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_6b8 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&arr_value,"test",(allocator<char> *)&local_540);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[4],_const_char_(&)[5],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)local_1a0,(char (*) [4])0xc8537f,(char (*) [5])"b\'ar");
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_1a0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)local_3a0,__l_00,(allocator_type *)&local_560);
  HelpExampleCliNamed((string *)&obj_value,(string *)&arr_value,(RPCArgList *)local_3a0);
  pvVar3 = (iterator)0x2;
  pUVar4 = &obj_value;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[40]>
            (local_618,&local_6c0,0x230,1,2,pUVar4,
             "HelpExampleCliNamed(\"test\", {{\"foo\", \"b\'ar\"}})",
             "> bitcoin-cli -named test foo=\'b\'\'\'ar\'\n",
             "\"> bitcoin-cli -named test foo=\'b\'\'\'ar\'\\n\"");
  std::__cxx11::string::~string((string *)&obj_value);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)local_3a0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
         *)local_1a0);
  std::__cxx11::string::~string((string *)&arr_value);
  local_6d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_6c8 = "";
  local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x231;
  file_02.m_begin = (iterator)&local_6d0;
  msg_02.m_end = (iterator)pUVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_6e0,
             msg_02);
  local_618[8] = 0;
  local_618._0_8_ = &PTR__lazy_ostream_011480b0;
  local_618._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_618._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_6f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_6e8 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&arr_value,"test",(allocator<char> *)&local_540);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[4],_const_char_(&)[5],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)local_1a0,(char (*) [4])0xc8537f,(char (*) [5])"b\"ar");
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_1a0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)local_3a0,__l_01,(allocator_type *)&local_560);
  HelpExampleCliNamed((string *)&obj_value,(string *)&arr_value,(RPCArgList *)local_3a0);
  pvVar3 = (iterator)0x2;
  pUVar4 = &obj_value;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[38]>
            (local_618,&local_6f0,0x231,1,2,pUVar4,
             "HelpExampleCliNamed(\"test\", {{\"foo\", \"b\\\"ar\"}})",
             "> bitcoin-cli -named test foo=\'b\"ar\'\n",
             "\"> bitcoin-cli -named test foo=\'b\\\"ar\'\\n\"");
  std::__cxx11::string::~string((string *)&obj_value);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)local_3a0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
         *)local_1a0);
  std::__cxx11::string::~string((string *)&arr_value);
  local_700 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_6f8 = "";
  local_710 = &boost::unit_test::basic_cstring<char_const>::null;
  local_708 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x232;
  file_03.m_begin = (iterator)&local_700;
  msg_03.m_end = (iterator)pUVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_710,
             msg_03);
  local_618[8] = 0;
  local_618._0_8_ = &PTR__lazy_ostream_011480b0;
  local_618._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_618._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_720 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_718 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&arr_value,"test",(allocator<char> *)&local_540);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[4],_const_char_(&)[5],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)local_1a0,(char (*) [4])0xc8537f,(char (*) [5])"b ar");
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)local_1a0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)local_3a0,__l_02,(allocator_type *)&local_560);
  HelpExampleCliNamed((string *)&obj_value,(string *)&arr_value,(RPCArgList *)local_3a0);
  pvVar3 = (iterator)0x2;
  pUVar4 = &obj_value;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[38]>
            (local_618,&local_720,0x232,1,2,pUVar4,
             "HelpExampleCliNamed(\"test\", {{\"foo\", \"b ar\"}})",
             "> bitcoin-cli -named test foo=\'b ar\'\n",
             "\"> bitcoin-cli -named test foo=\'b ar\'\\n\"");
  std::__cxx11::string::~string((string *)&obj_value);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)local_3a0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
         *)local_1a0);
  std::__cxx11::string::~string((string *)&arr_value);
  local_218 = local_208;
  local_210 = 0;
  local_208[0] = 0;
  str._M_string_length = in_stack_fffffffffffff780;
  str._M_dataplus._M_p = (pointer)in_stack_fffffffffffff778;
  str.field_2._M_allocated_capacity = in_stack_fffffffffffff788;
  str.field_2._8_8_ = in_stack_fffffffffffff790;
  UniValue::UniValue(&obj_value,VOBJ,str);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::string<std::allocator<char>>(local_238,"foo",(allocator<char> *)local_1a0);
  UniValue::UniValue<const_char_(&)[4],_char[4],_true>(&local_290,(char (*) [4])0xc7eff8);
  key._M_string_length = in_stack_fffffffffffff780;
  key._M_dataplus._M_p = (pointer)in_stack_fffffffffffff778;
  key.field_2._M_allocated_capacity = in_stack_fffffffffffff788;
  key.field_2._8_8_ = in_stack_fffffffffffff790;
  val_02.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff7a0;
  val_02._0_8_ = in_stack_fffffffffffff798;
  val_02._16_39_ = in_stack_fffffffffffff7a8;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._7_1_ = in_stack_fffffffffffff7cf;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff7d0._0_8_;
  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff7d0._8_24_;
  UniValue::pushKV(&obj_value,key,val_02);
  UniValue::~UniValue(&local_290);
  std::__cxx11::string::~string(local_238);
  std::__cxx11::string::string<std::allocator<char>>(local_2b0,"b",(allocator<char> *)local_1a0);
  local_618._0_8_ = local_618._0_8_ & 0xffffffffffffff00;
  UniValue::UniValue<bool,_bool,_true>(&local_308,(bool *)local_618);
  key_00._M_string_length = in_stack_fffffffffffff780;
  key_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff778;
  key_00.field_2._M_allocated_capacity = in_stack_fffffffffffff788;
  key_00.field_2._8_8_ = in_stack_fffffffffffff790;
  val_03.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff7a0;
  val_03._0_8_ = in_stack_fffffffffffff798;
  val_03._16_39_ = in_stack_fffffffffffff7a8;
  val_03.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._7_1_ = in_stack_fffffffffffff7cf;
  val_03.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff7d0._0_8_;
  val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff7d0._8_24_;
  UniValue::pushKV(&obj_value,key_00,val_03);
  UniValue::~UniValue(&local_308);
  std::__cxx11::string::~string(local_2b0);
  std::__cxx11::string::string<std::allocator<char>>(local_328,"n",(allocator<char> *)local_618);
  local_1a0._0_4_ = 1;
  UniValue::UniValue<int,_int,_true>(&local_380,(int *)local_1a0);
  key_01._M_string_length = in_stack_fffffffffffff780;
  key_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff778;
  key_01.field_2._M_allocated_capacity = in_stack_fffffffffffff788;
  key_01.field_2._8_8_ = in_stack_fffffffffffff790;
  val_04.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff7a0;
  val_04._0_8_ = in_stack_fffffffffffff798;
  val_04._16_39_ = in_stack_fffffffffffff7a8;
  val_04.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._7_1_ = in_stack_fffffffffffff7cf;
  val_04.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff7d0._0_8_;
  val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffff7d0._8_24_;
  UniValue::pushKV(&obj_value,key_01,val_04);
  UniValue::~UniValue(&local_380);
  std::__cxx11::string::~string(local_328);
  local_730 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_728 = "";
  local_740 = &boost::unit_test::basic_cstring<char_const>::null;
  local_738 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x239;
  file_04.m_begin = (iterator)&local_730;
  msg_04.m_end = (iterator)pUVar4;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_740,
             msg_04);
  local_618[8] = 0;
  local_618._0_8_ = &PTR__lazy_ostream_011480b0;
  local_618._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_618._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_750 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_748 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3a0,"test",(allocator<char> *)&local_560);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[5],_UniValue_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)local_1a0,(char (*) [5])0xe22602,&obj_value);
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)local_1a0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)&local_540,__l_03,(allocator_type *)&local_580);
  HelpExampleCliNamed((string *)&arr_value,(string *)local_3a0,(RPCArgList *)&local_540);
  pvVar3 = (iterator)0x2;
  pUVar4 = &arr_value;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[64]>
            (local_618,&local_750,0x239,1,2,pUVar4,
             "HelpExampleCliNamed(\"test\", {{\"name\", obj_value}})",
             "> bitcoin-cli -named test name=\'{\"foo\":\"bar\",\"b\":false,\"n\":1}\'\n",
             "\"> bitcoin-cli -named test name=\'{\\\"foo\\\":\\\"bar\\\",\\\"b\\\":false,\\\"n\\\":1}\'\\n\""
            );
  std::__cxx11::string::~string((string *)&arr_value);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)&local_540);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
         *)local_1a0);
  std::__cxx11::string::~string((string *)local_3a0);
  local_760 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_758 = "";
  local_770 = &boost::unit_test::basic_cstring<char_const>::null;
  local_768 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x23a;
  file_05.m_begin = (iterator)&local_760;
  msg_05.m_end = (iterator)pUVar4;
  msg_05.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_770,
             msg_05);
  local_618[8] = 0;
  local_618._0_8_ = &PTR__lazy_ostream_011480b0;
  local_618._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_618._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_780 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_778 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3a0,"test",(allocator<char> *)&local_560);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[5],_UniValue_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)local_1a0,(char (*) [5])0xe22602,&obj_value);
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)local_1a0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)&local_540,__l_04,(allocator_type *)&local_580);
  HelpExampleRpcNamed((string *)&arr_value,(string *)local_3a0,(RPCArgList *)&local_540);
  pvVar3 = (iterator)0x2;
  pUVar4 = &arr_value;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[206]>
            (local_618,&local_780,0x23a,1,2,pUVar4,
             "HelpExampleRpcNamed(\"test\", {{\"name\", obj_value}})",
             "> curl --user myusername --data-binary \'{\"jsonrpc\": \"2.0\", \"id\": \"curltest\", \"method\": \"test\", \"params\": {\"name\":{\"foo\":\"bar\",\"b\":false,\"n\":1}}}\' -H \'content-type: application/json\' http://127.0.0.1:8332/\n"
             ,
             "\"> curl --user myusername --data-binary \'{\\\"jsonrpc\\\": \\\"2.0\\\", \\\"id\\\": \\\"curltest\\\", \\\"method\\\": \\\"test\\\", \\\"params\\\": {\\\"name\\\":{\\\"foo\\\":\\\"bar\\\",\\\"b\\\":false,\\\"n\\\":1}}}\' -H \'content-type: application/json\' http://127.0.0.1:8332/\\n\""
            );
  std::__cxx11::string::~string((string *)&arr_value);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)&local_540);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
         *)local_1a0);
  std::__cxx11::string::~string((string *)local_3a0);
  local_418 = local_408;
  local_410 = 0;
  local_408[0] = 0;
  str_00._M_string_length = in_stack_fffffffffffff780;
  str_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff778;
  str_00.field_2._M_allocated_capacity = in_stack_fffffffffffff788;
  str_00.field_2._8_8_ = in_stack_fffffffffffff790;
  UniValue::UniValue(&arr_value,VARR,str_00);
  std::__cxx11::string::~string((string *)&local_418);
  UniValue::UniValue<const_char_(&)[4],_char[4],_true>(&local_470,(char (*) [4])0xc7eff8);
  val.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff780;
  val._0_8_ = in_stack_fffffffffffff778;
  val.val._M_string_length = in_stack_fffffffffffff788;
  val.val.field_2._M_allocated_capacity = in_stack_fffffffffffff790;
  val.val.field_2._8_8_ = in_stack_fffffffffffff798;
  val.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff7a0;
  val._48_39_ = in_stack_fffffffffffff7a8;
  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage._7_1_ = in_stack_fffffffffffff7cf;
  UniValue::push_back(&arr_value,val);
  UniValue::~UniValue(&local_470);
  local_1a0._0_8_ = local_1a0._0_8_ & 0xffffffffffffff00;
  UniValue::UniValue<bool,_bool,_true>(&local_4c8,(bool *)local_1a0);
  val_00.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff780;
  val_00._0_8_ = in_stack_fffffffffffff778;
  val_00.val._M_string_length = in_stack_fffffffffffff788;
  val_00.val.field_2._M_allocated_capacity = in_stack_fffffffffffff790;
  val_00.val.field_2._8_8_ = in_stack_fffffffffffff798;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff7a0;
  val_00._48_39_ = in_stack_fffffffffffff7a8;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = in_stack_fffffffffffff7cf;
  UniValue::push_back(&arr_value,val_00);
  UniValue::~UniValue(&local_4c8);
  local_1a0._0_4_ = 1;
  UniValue::UniValue<int,_int,_true>(&local_520,(int *)local_1a0);
  val_01.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff780;
  val_01._0_8_ = in_stack_fffffffffffff778;
  val_01.val._M_string_length = in_stack_fffffffffffff788;
  val_01.val.field_2._M_allocated_capacity = in_stack_fffffffffffff790;
  val_01.val.field_2._8_8_ = in_stack_fffffffffffff798;
  val_01.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff7a0;
  val_01._48_39_ = in_stack_fffffffffffff7a8;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = in_stack_fffffffffffff7cf;
  UniValue::push_back(&arr_value,val_01);
  UniValue::~UniValue(&local_520);
  local_790 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_788 = "";
  local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_798 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x241;
  file_06.m_begin = (iterator)&local_790;
  msg_06.m_end = (iterator)pUVar4;
  msg_06.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_7a0,
             msg_06);
  local_618[8] = 0;
  local_618._0_8_ = &PTR__lazy_ostream_011480b0;
  local_618._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_618._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_7b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_7a8 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_540,"test",(allocator<char> *)&local_580);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[5],_UniValue_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)local_1a0,(char (*) [5])0xe22602,&arr_value);
  __l_05._M_len = 1;
  __l_05._M_array = (iterator)local_1a0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)&local_560,__l_05,(allocator_type *)&local_5a0);
  HelpExampleCliNamed((string *)local_3a0,&local_540,(RPCArgList *)&local_560);
  pvVar2 = (iterator)0x2;
  pvVar3 = local_3a0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[50]>
            (local_618,&local_7b0,0x241,1,2,pvVar3,
             "HelpExampleCliNamed(\"test\", {{\"name\", arr_value}})",
             "> bitcoin-cli -named test name=\'[\"bar\",false,1]\'\n",
             "\"> bitcoin-cli -named test name=\'[\\\"bar\\\",false,1]\'\\n\"");
  std::__cxx11::string::~string((string *)local_3a0);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)&local_560);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
         *)local_1a0);
  std::__cxx11::string::~string((string *)&local_540);
  local_7c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_7b8 = "";
  local_7d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x242;
  file_07.m_begin = (iterator)&local_7c0;
  msg_07.m_end = pvVar3;
  msg_07.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_7d0,
             msg_07);
  local_618[8] = 0;
  local_618._0_8_ = &PTR__lazy_ostream_011480b0;
  local_618._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_618._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_7e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_7d8 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_540,"test",(allocator<char> *)&local_580);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[5],_UniValue_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)local_1a0,(char (*) [5])0xe22602,&arr_value);
  __l_06._M_len = 1;
  __l_06._M_array = (iterator)local_1a0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)&local_560,__l_06,(allocator_type *)&local_5a0);
  HelpExampleRpcNamed((string *)local_3a0,&local_540,(RPCArgList *)&local_560);
  pvVar2 = (iterator)0x2;
  pvVar3 = local_3a0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[192]>
            (local_618,&local_7e0,0x242,1,2,pvVar3,
             "HelpExampleRpcNamed(\"test\", {{\"name\", arr_value}})",
             "> curl --user myusername --data-binary \'{\"jsonrpc\": \"2.0\", \"id\": \"curltest\", \"method\": \"test\", \"params\": {\"name\":[\"bar\",false,1]}}\' -H \'content-type: application/json\' http://127.0.0.1:8332/\n"
             ,
             "\"> curl --user myusername --data-binary \'{\\\"jsonrpc\\\": \\\"2.0\\\", \\\"id\\\": \\\"curltest\\\", \\\"method\\\": \\\"test\\\", \\\"params\\\": {\\\"name\\\":[\\\"bar\\\",false,1]}}\' -H \'content-type: application/json\' http://127.0.0.1:8332/\\n\""
            );
  std::__cxx11::string::~string((string *)local_3a0);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)&local_560);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
         *)local_1a0);
  std::__cxx11::string::~string((string *)&local_540);
  local_7f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_7e8 = "";
  local_800 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x245;
  file_08.m_begin = (iterator)&local_7f0;
  msg_08.m_end = pvVar3;
  msg_08.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_800,
             msg_08);
  local_3a0[8] = 0;
  local_3a0._0_8_ = &PTR__lazy_ostream_011480b0;
  local_3a0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_3a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_810 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_808 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,"foo",(allocator<char> *)&stack0xfffffffffffff7ef);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[4],_bool,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)local_1a0,(char (*) [4])0xe4d23a,(bool *)&stack0xfffffffffffff7cf);
  __l_07._M_len = 1;
  __l_07._M_array = (iterator)local_1a0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)&stack0xfffffffffffff7d0,__l_07,(allocator_type *)&stack0xfffffffffffff7ce);
  HelpExampleCliNamed(&local_540,&local_560,(RPCArgList *)&stack0xfffffffffffff7d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a0,"foo",(allocator<char> *)&stack0xfffffffffffff7cd);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[4],_const_char_(&)[5],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)local_618,(char (*) [4])0xe4d23a,(char (*) [5])0xe2c245);
  __l_08._M_len = 1;
  __l_08._M_array = (iterator)local_618;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)&stack0xfffffffffffff7b0,__l_08,(allocator_type *)&stack0xfffffffffffff7af);
  HelpExampleCliNamed(&local_580,&local_5a0,(RPCArgList *)&stack0xfffffffffffff7b0);
  pvVar3 = (iterator)0x2;
  psVar5 = &local_540;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (local_3a0,&local_810,0x245,1,2,psVar5,"HelpExampleCliNamed(\"foo\", {{\"arg\", true}})"
             ,&local_580,"HelpExampleCliNamed(\"foo\", {{\"arg\", \"true\"}})");
  std::__cxx11::string::~string((string *)&local_580);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)&stack0xfffffffffffff7b0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
         *)local_618);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::__cxx11::string::~string((string *)&local_540);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)&stack0xfffffffffffff7d0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
         *)local_1a0);
  std::__cxx11::string::~string((string *)&local_560);
  file_09.m_end = (iterator)0x248;
  file_09.m_begin = &stack0xfffffffffffff798;
  msg_09.m_end = (iterator)psVar5;
  msg_09.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,
             (size_t)&stack0xfffffffffffff788,msg_09);
  local_3a0[8] = 0;
  local_3a0._0_8_ = &PTR__lazy_ostream_011480b0;
  local_3a0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_3a0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,"foo",(allocator<char> *)&stack0xfffffffffffff7ef);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[4],_bool,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)local_1a0,(char (*) [4])0xe4d23a,(bool *)&stack0xfffffffffffff7cf);
  __l_09._M_len = 1;
  __l_09._M_array = (iterator)local_1a0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)&stack0xfffffffffffff7d0,__l_09,(allocator_type *)&stack0xfffffffffffff7ce);
  HelpExampleRpcNamed(&local_540,&local_560,(RPCArgList *)&stack0xfffffffffffff7d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a0,"foo",(allocator<char> *)&stack0xfffffffffffff7cd);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[4],_const_char_(&)[5],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)local_618,(char (*) [4])0xe4d23a,(char (*) [5])0xe2c245);
  __l_10._M_len = 1;
  __l_10._M_array = (iterator)local_618;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)&stack0xfffffffffffff7b0,__l_10,(allocator_type *)&stack0xfffffffffffff7af);
  HelpExampleRpcNamed(&local_580,&local_5a0,(RPCArgList *)&stack0xfffffffffffff7b0);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::ne_impl,std::__cxx11::string,std::__cxx11::string>
            (local_3a0,&stack0xfffffffffffff778,0x248,1,3,&local_540,
             "HelpExampleRpcNamed(\"foo\", {{\"arg\", true}})",&local_580,
             "HelpExampleRpcNamed(\"foo\", {{\"arg\", \"true\"}})");
  std::__cxx11::string::~string((string *)&local_580);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)&stack0xfffffffffffff7b0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
         *)local_618);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::__cxx11::string::~string((string *)&local_540);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)&stack0xfffffffffffff7d0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
         *)local_1a0);
  std::__cxx11::string::~string((string *)&local_560);
  UniValue::~UniValue(&arr_value);
  UniValue::~UniValue(&obj_value);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector(&local_630);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(help_example)
{
    // test different argument types
    const RPCArgList& args = {{"foo", "bar"}, {"b", true}, {"n", 1}};
    BOOST_CHECK_EQUAL(HelpExampleCliNamed("test", args), "> bitcoin-cli -named test foo=bar b=true n=1\n");
    BOOST_CHECK_EQUAL(HelpExampleRpcNamed("test", args), "> curl --user myusername --data-binary '{\"jsonrpc\": \"2.0\", \"id\": \"curltest\", \"method\": \"test\", \"params\": {\"foo\":\"bar\",\"b\":true,\"n\":1}}' -H 'content-type: application/json' http://127.0.0.1:8332/\n");

    // test shell escape
    BOOST_CHECK_EQUAL(HelpExampleCliNamed("test", {{"foo", "b'ar"}}), "> bitcoin-cli -named test foo='b'''ar'\n");
    BOOST_CHECK_EQUAL(HelpExampleCliNamed("test", {{"foo", "b\"ar"}}), "> bitcoin-cli -named test foo='b\"ar'\n");
    BOOST_CHECK_EQUAL(HelpExampleCliNamed("test", {{"foo", "b ar"}}), "> bitcoin-cli -named test foo='b ar'\n");

    // test object params
    UniValue obj_value(UniValue::VOBJ);
    obj_value.pushKV("foo", "bar");
    obj_value.pushKV("b", false);
    obj_value.pushKV("n", 1);
    BOOST_CHECK_EQUAL(HelpExampleCliNamed("test", {{"name", obj_value}}), "> bitcoin-cli -named test name='{\"foo\":\"bar\",\"b\":false,\"n\":1}'\n");
    BOOST_CHECK_EQUAL(HelpExampleRpcNamed("test", {{"name", obj_value}}), "> curl --user myusername --data-binary '{\"jsonrpc\": \"2.0\", \"id\": \"curltest\", \"method\": \"test\", \"params\": {\"name\":{\"foo\":\"bar\",\"b\":false,\"n\":1}}}' -H 'content-type: application/json' http://127.0.0.1:8332/\n");

    // test array params
    UniValue arr_value(UniValue::VARR);
    arr_value.push_back("bar");
    arr_value.push_back(false);
    arr_value.push_back(1);
    BOOST_CHECK_EQUAL(HelpExampleCliNamed("test", {{"name", arr_value}}), "> bitcoin-cli -named test name='[\"bar\",false,1]'\n");
    BOOST_CHECK_EQUAL(HelpExampleRpcNamed("test", {{"name", arr_value}}), "> curl --user myusername --data-binary '{\"jsonrpc\": \"2.0\", \"id\": \"curltest\", \"method\": \"test\", \"params\": {\"name\":[\"bar\",false,1]}}' -H 'content-type: application/json' http://127.0.0.1:8332/\n");

    // test types don't matter for shell
    BOOST_CHECK_EQUAL(HelpExampleCliNamed("foo", {{"arg", true}}), HelpExampleCliNamed("foo", {{"arg", "true"}}));

    // test types matter for Rpc
    BOOST_CHECK_NE(HelpExampleRpcNamed("foo", {{"arg", true}}), HelpExampleRpcNamed("foo", {{"arg", "true"}}));
}